

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O0

static_string_view cmFileSetVisibilityToName(cmFileSetVisibility vis)

{
  undefined1 auStack_18 [4];
  cmFileSetVisibility vis_local;
  
  if (vis == Private) {
    _auStack_18 = (string_view)cm::operator____s("PRIVATE",7);
  }
  else if (vis == Public) {
    _auStack_18 = (string_view)cm::operator____s("PUBLIC",6);
  }
  else if (vis == Interface) {
    _auStack_18 = (string_view)cm::operator____s("INTERFACE",9);
  }
  else {
    _auStack_18 = (string_view)cm::operator____s("",0);
  }
  return (static_string_view)_auStack_18;
}

Assistant:

cm::static_string_view cmFileSetVisibilityToName(cmFileSetVisibility vis)
{
  switch (vis) {
    case cmFileSetVisibility::Interface:
      return "INTERFACE"_s;
    case cmFileSetVisibility::Public:
      return "PUBLIC"_s;
    case cmFileSetVisibility::Private:
      return "PRIVATE"_s;
  }
  return ""_s;
}